

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::on_dht_announce(session_impl *this,error_code *e)

{
  int iVar1;
  uint uVar2;
  pointer psVar3;
  pointer psVar4;
  int iVar5;
  ulong uVar6;
  _Elt_pointer pwVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar9;
  long *local_48 [2];
  long local_38 [2];
  
  if (e->failed_ == true) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      uVar2 = e->val_;
      (*e->cat_->_vptr_error_category[4])(local_48,e->cat_,(ulong)uVar2);
      session_log(this,"aborting DHT announce timer (%d): %s",(ulong)uVar2,local_48[0]);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  else {
    if (this->m_abort == true) {
      session_log(this,"aborting DHT announce timer: m_abort set");
      return;
    }
    if ((this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      ::std::
      deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
      ::clear(&this->m_dht_torrents);
      return;
    }
    update_dht_announce_interval(this);
    pwVar7 = (this->m_dht_torrents).
             super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_dht_torrents).
        super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pwVar7) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        this_02 = (pwVar7->super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_002c6ea4:
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_002c6ea7:
          this_01 = (torrent *)0x0;
        }
        else {
          iVar5 = this_02->_M_use_count;
          do {
            if (iVar5 == 0) goto LAB_002c6ea4;
            LOCK();
            iVar1 = this_02->_M_use_count;
            bVar9 = iVar5 == iVar1;
            if (bVar9) {
              this_02->_M_use_count = iVar5 + 1;
              iVar1 = iVar5;
            }
            iVar5 = iVar1;
            UNLOCK();
          } while (!bVar9);
          if (this_02->_M_use_count == 0) goto LAB_002c6ea7;
          this_01 = (pwVar7->super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        ::std::
        deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
        ::pop_front(&this->m_dht_torrents);
        if (this_01 != (torrent *)0x0) {
          torrent::dht_announce(this_01);
          break;
        }
        pwVar7 = (this->m_dht_torrents).
                 super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        this_00 = this_02;
      } while ((this->m_dht_torrents).
               super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != pwVar7);
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      if (this_01 != (torrent *)0x0) {
        return;
      }
    }
    psVar3 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar4) {
      uVar8 = this->m_next_dht_torrent;
      if ((ulong)((long)psVar4 - (long)psVar3 >> 4) <= uVar8) {
        this->m_next_dht_torrent = 0;
        uVar8 = 0;
      }
      torrent::dht_announce
                (psVar3[uVar8].
                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar6 = this->m_next_dht_torrent + 1;
      uVar8 = 0;
      if (uVar6 < (ulong)((long)(this->m_torrents).m_array.
                                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_torrents).m_array.
                                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        uVar8 = uVar6;
      }
      this->m_next_dht_torrent = uVar8;
    }
  }
  return;
}

Assistant:

void session_impl::on_dht_announce(error_code const& e)
	{
		COMPLETE_ASYNC("session_impl::on_dht_announce");
		TORRENT_ASSERT(is_single_thread());
		if (e)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("aborting DHT announce timer (%d): %s"
					, e.value(), e.message().c_str());
			}
#endif
			return;
		}

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("aborting DHT announce timer: m_abort set");
#endif
			return;
		}

		if (!m_dht)
		{
			m_dht_torrents.clear();
			return;
		}

		TORRENT_ASSERT(m_dht);

		update_dht_announce_interval();

		if (!m_dht_torrents.empty())
		{
			std::shared_ptr<torrent> t;
			do
			{
				t = m_dht_torrents.front().lock();
				m_dht_torrents.pop_front();
			} while (!t && !m_dht_torrents.empty());

			if (t)
			{
				t->dht_announce();
				return;
			}
		}
		if (m_torrents.empty()) return;

		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
		m_torrents[m_next_dht_torrent]->dht_announce();
		// TODO: 2 make a list for torrents that want to be announced on the DHT so we
		// don't have to loop over all torrents, just to find the ones that want to announce
		++m_next_dht_torrent;
		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
	}